

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_00;
  long lVar1;
  undefined7 in_register_00000011;
  pointer pcVar2;
  undefined1 *local_a0;
  string optName;
  long local_78;
  long local_70 [2];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  undefined4 local_48;
  undefined2 uStack_44;
  undefined2 uStack_42;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_48 = 0x3d3a;
  uStack_44 = 0;
  local_50._M_p = (pointer)0x5;
  local_60 = tokens;
  local_58 = (undefined1  [8])&local_48;
  lVar1 = std::__cxx11::string::find((char)local_58,CONCAT71(in_register_00000011,c) & 0xffffffff);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,CONCAT26(uStack_42,CONCAT24(uStack_44,local_48)) + 1);
  }
  if (lVar1 == -1) {
    return this->mode;
  }
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)arg);
  this_00 = local_60;
  if (this->mode == SlashOpt) {
    if (optName._M_dataplus._M_p != (pointer)0x1) goto LAB_0014738b;
    local_58._0_4_ = 1;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_a0,local_a0 + 1);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(this_00,(Token *)local_58);
  }
  else {
    if (this->mode == ShortOpt) {
      if (optName._M_dataplus._M_p != (pointer)0x0) {
        pcVar2 = (pointer)0x0;
        do {
          std::__cxx11::string::substr((ulong)((long)&optName.field_2 + 8),(ulong)&local_a0);
          local_58._0_4_ = 1;
          local_50._M_p = (pointer)&local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,optName.field_2._8_8_,local_78 + optName.field_2._8_8_);
          std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
          emplace_back<Catch::Clara::Parser::Token>(this_00,(Token *)local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_p != &local_40) {
            operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
          }
          if ((long *)optName.field_2._8_8_ != local_70) {
            operator_delete((void *)optName.field_2._8_8_,local_70[0] + 1);
          }
          pcVar2 = pcVar2 + 1;
        } while (pcVar2 < optName._M_dataplus._M_p);
      }
      goto LAB_001473ce;
    }
LAB_0014738b:
    local_58._0_4_ = 2;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_a0,optName._M_dataplus._M_p + (long)local_a0);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(this_00,(Token *)local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
LAB_001473ce:
  if ((size_type *)local_a0 != &optName._M_string_length) {
    operator_delete(local_a0,optName._M_string_length + 1);
  }
  return None;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 5 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }